

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  StreamVendorIo *this;
  invalid_argument e;
  undefined1 local_30 [8];
  SimpleVendor vendor;
  char **argv_local;
  int argc_local;
  
  vendor.vio = (VendorIo *)argv;
  this = (StreamVendorIo *)operator_new(0x18);
  StreamVendorIo::StreamVendorIo(this);
  SimpleVendor::SimpleVendor((SimpleVendor *)local_30,argc,argv,(VendorIo *)this);
  SimpleVendor::Vend((SimpleVendor *)local_30);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    try {
        SimpleVendor vendor(argc, argv);
        vendor.Vend();
    } catch (invalid_argument e) {
        return 1;
    }
    return 0;
}